

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O0

Array<const_unsigned_char> * __thiscall
kj::Array<const_char>::releaseAsBytes
          (Array<const_unsigned_char> *__return_storage_ptr__,Array<const_char> *this)

{
  Array<const_char> *this_local;
  Array<const_unsigned_char> *result;
  
  Array<const_unsigned_char>::Array
            (__return_storage_ptr__,(uchar *)this->ptr,this->size_,this->disposer);
  this->ptr = (char *)0x0;
  this->size_ = 0;
  return __return_storage_ptr__;
}

Assistant:

inline Array<PropagateConst<T, byte>> releaseAsBytes() {
    // Like asBytes() but transfers ownership.
    static_assert(sizeof(T) == sizeof(byte),
        "releaseAsBytes() only possible on arrays with byte-size elements (e.g. chars).");
    Array<PropagateConst<T, byte>> result(
        reinterpret_cast<PropagateConst<T, byte>*>(ptr), size_, *disposer);
    ptr = nullptr;
    size_ = 0;
    return result;
  }